

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_tessellator.cc
# Opt level: O3

void __thiscall
S2EdgeTessellator::AppendProjected
          (S2EdgeTessellator *this,S2Point *a,S2Point *b,
          vector<Vector2<double>,_std::allocator<Vector2<double>_>_> *vertices)

{
  double dVar1;
  iterator __position;
  long lVar2;
  bool bVar3;
  VType extraout_XMM0_Qa;
  ostream *in_XMM1_Qa;
  R2Point RVar4;
  R2Point pb;
  R2Point local_48;
  S2LogMessage local_38;
  
  (*this->proj_->_vptr_Projection[2])();
  local_48.c_[1] = (VType)in_XMM1_Qa;
  local_48.c_[0] = extraout_XMM0_Qa;
  __position._M_current = *(Vector2<double> **)(vertices + 8);
  if (*(Vector2<double> **)vertices == __position._M_current) {
    if (*(Vector2<double> **)vertices == *(Vector2<double> **)(vertices + 0x10)) {
      std::vector<Vector2<double>,std::allocator<Vector2<double>>>::
      _M_realloc_insert<Vector2<double>const&>
                ((vector<Vector2<double>,std::allocator<Vector2<double>>> *)vertices,__position,
                 &local_48);
    }
    else {
      (__position._M_current)->c_[0] = extraout_XMM0_Qa;
      (__position._M_current)->c_[1] = (VType)in_XMM1_Qa;
      *(long *)(vertices + 8) = *(long *)(vertices + 8) + 0x10;
    }
  }
  else {
    RVar4 = S2::Projection::WrapDestination(this->proj_,__position._M_current + -1,&local_48);
    local_48.c_[0] = RVar4.c_[0];
    local_48.c_[1] = RVar4.c_[1];
    lVar2 = 0;
    do {
      dVar1 = *(double *)(*(long *)(vertices + 8) + -0x10 + lVar2);
      in_XMM1_Qa = *(ostream **)((long)local_48.c_ + lVar2);
      if ((dVar1 != (double)in_XMM1_Qa) || (NAN(dVar1) || NAN((double)in_XMM1_Qa))) break;
      bVar3 = lVar2 != 8;
      lVar2 = lVar2 + 8;
    } while (bVar3);
    if ((dVar1 != (double)in_XMM1_Qa) || (NAN(dVar1) || NAN((double)in_XMM1_Qa))) {
      S2LogMessage::S2LogMessage
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_tessellator.cc"
                 ,0xda,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_38.stream_,"Check failed: (vertices->back()) == (pa) ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_38.stream_,"Appended edges must form a chain",0x20);
      abort();
    }
  }
  (*this->proj_->_vptr_Projection[2])(this->proj_,b);
  local_38.stream_ = in_XMM1_Qa;
  AppendProjected(this,&local_48,a,(R2Point *)&local_38,b,vertices);
  return;
}

Assistant:

void S2EdgeTessellator::AppendProjected(
    const S2Point& a, const S2Point& b, vector<R2Point>* vertices) const {
  R2Point pa = proj_.Project(a);
  if (vertices->empty()) {
    vertices->push_back(pa);
  } else {
    pa = proj_.WrapDestination(vertices->back(), pa);
    S2_DCHECK_EQ(vertices->back(), pa) << "Appended edges must form a chain";
  }
  R2Point pb = proj_.Project(b);
  AppendProjected(pa, a, pb, b, vertices);
}